

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * fs_get_cache_file(string *filename)

{
  bool bVar1;
  long lVar2;
  runtime_error *this;
  char in_SIL;
  string *in_RDI;
  bool success;
  string cache_directory;
  string *in_stack_000000b8;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  lVar2 = std::__cxx11::string::find(in_SIL,0x2f);
  if (lVar2 != -1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
               ,0x355,"GGML_ASSERT(%s) failed",
               "filename.find(DIRECTORY_SEPARATOR) == std::string::npos");
  }
  fs_get_cache_directory_abi_cxx11_();
  bVar1 = fs_create_directory_with_parents(in_stack_000000b8);
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffff98);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+(in_stack_ffffffffffffff98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string fs_get_cache_file(const std::string & filename) {
    GGML_ASSERT(filename.find(DIRECTORY_SEPARATOR) == std::string::npos);
    std::string cache_directory = fs_get_cache_directory();
    const bool success = fs_create_directory_with_parents(cache_directory);
    if (!success) {
        throw std::runtime_error("failed to create cache directory: " + cache_directory);
    }
    return cache_directory + filename;
}